

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lexer.c
# Opt level: O0

_Bool CrawlOperators(Lexer *lexer)

{
  char cVar1;
  char cVar2;
  ushort **ppuVar3;
  char nextChar;
  char currentChar;
  Lexer *lexer_local;
  
  cVar1 = GetCurrentCharacter(lexer);
  cVar2 = PeekNextCharacter(lexer);
  SetTokenStart(lexer);
  switch(cVar1) {
  case '!':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  default:
    SetTokenEnd(lexer);
    return false;
  case '#':
  case '$':
  case '(':
  case ')':
  case ',':
  case ':':
  case ';':
  case '@':
  case '[':
  case ']':
  case '`':
  case '{':
  case '}':
    break;
  case '%':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  case '&':
    if (((cVar2 == '&') || (cVar2 == '^')) || (cVar2 == '=')) {
      GetNextCharacter(lexer);
    }
    break;
  case '*':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  case '+':
    if ((cVar2 == '+') || (cVar2 == '=')) {
      GetNextCharacter(lexer);
    }
    break;
  case '-':
    if (((cVar2 == '-') || (cVar2 == '=')) || (cVar2 == '>')) {
      GetNextCharacter(lexer);
    }
    ppuVar3 = __ctype_b_loc();
    if ((((*ppuVar3)[(int)cVar2] & 0x800) != 0) || (cVar2 == '.')) {
      CrawlNumbers(lexer);
    }
    break;
  case '.':
    ppuVar3 = __ctype_b_loc();
    if (((*ppuVar3)[(int)cVar2] & 0x800) != 0) {
      CrawlNumbers(lexer);
    }
    break;
  case '/':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  case '<':
    if ((cVar2 == '-') || (cVar2 == '=')) {
      GetNextCharacter(lexer);
    }
    else if (cVar2 == '<') {
      GetNextCharacter(lexer);
    }
    break;
  case '=':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  case '>':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    else if (cVar2 == '>') {
      GetNextCharacter(lexer);
    }
    break;
  case '^':
    if (cVar2 == '=') {
      GetNextCharacter(lexer);
    }
    break;
  case '|':
    if ((cVar2 == '|') || (cVar2 == '=')) {
      GetNextCharacter(lexer);
    }
  }
  GetNextCharacter(lexer);
  SetTokenEnd(lexer);
  return true;
}

Assistant:

bool CrawlOperators(Lexer* lexer){
	char currentChar = GetCurrentCharacter(lexer);
	char nextChar = PeekNextCharacter(lexer);
	SetTokenStart(lexer);
	switch (currentChar){
		case '/': {
			if (nextChar == '/' || nextChar == '*') {} // TODO: Eat Comments
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '*': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '=': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '+': {
			if (nextChar == '+' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '-': {
			if (nextChar == '-' || nextChar == '=' || nextChar == '>') GetNextCharacter(lexer);
			if (isdigit(nextChar) || nextChar == '.') CrawlNumbers(lexer);
			break;
		}
		case '%': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '<': {
			if (nextChar == '-' || nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '<') GetNextCharacter(lexer); // TODO: Implement <<=
			break;
		}
		case '>': {
			if (nextChar == '=') GetNextCharacter(lexer);
			else if (nextChar == '>') GetNextCharacter(lexer); // TODO: Implement >>=
			break;
		}
		case '!': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '&': {
			if (nextChar == '&' || nextChar == '^' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '|': {
			if (nextChar == '|' || nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '^': {
			if (nextChar == '=') GetNextCharacter(lexer);
			break;
		}
		case '.': {
			if (isdigit(nextChar)) CrawlNumbers(lexer);
			break;
		}
		case '`':
		case '@':
		case '$':
		case ';':
		case ',':
		case '(':
		case ')':
		case '[':
		case ']':
		case '{':
		case '}':
		case '#':
		case ':': break;
		default: {
			SetTokenEnd(lexer);
			return false;
		}
	}
	GetNextCharacter(lexer);
	SetTokenEnd(lexer);
	return true;
}